

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O1

int __thiscall
OpenSSLWrapper::SslConnection::ShutDownConnection(SslConnection *this,int *iErrorHint)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  wstring *pwVar4;
  SslConnection *this_00;
  long *plVar5;
  runtime_error *this_01;
  wchar_t *pwVar6;
  ulong uVar7;
  undefined8 uVar8;
  string local_130;
  wchar_t *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if (this->m_ssl == (SSL *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Not Initialized");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0 < this->m_iShutDownFlag) goto LAB_00123279;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxSsl);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar2 = SSL_shutdown((SSL *)this->m_ssl);
  this->m_iShutDownFlag = iVar2;
  if (iVar2 < 0) {
    uVar3 = SSL_get_error((SSL *)this->m_ssl,iVar2);
    if (iErrorHint != (int *)0x0) {
      *iErrorHint = uVar3;
    }
    if (uVar3 != 2) {
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                (&local_90,vswprintf,0x10,L"%d",(ulong)(uint)this->m_iShutDownFlag);
      pwVar4 = (wstring *)std::__cxx11::wstring::replace((ulong)&local_90,0,(wchar_t *)0x0,0x1363f8)
      ;
      std::__cxx11::wstring::wstring((wstring *)local_70,pwVar4);
      pwVar4 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_70);
      std::__cxx11::wstring::wstring((wstring *)&local_b0,pwVar4);
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                (&local_d0,vswprintf,0x10,L"%d",(ulong)uVar3);
      uVar7 = 3;
      if (local_b0 != local_a0) {
        uVar7 = local_a0[0];
      }
      if (uVar7 < local_d0._M_string_length + local_a8) {
        uVar8 = 3;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          uVar8 = local_d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_d0._M_string_length + local_a8) goto LAB_00122fd2;
        pwVar4 = (wstring *)
                 std::__cxx11::wstring::replace((ulong)&local_d0,0,(wchar_t *)0x0,(ulong)local_b0);
      }
      else {
LAB_00122fd2:
        pwVar4 = (wstring *)
                 std::__cxx11::wstring::_M_append
                           ((wchar_t *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
      }
      std::__cxx11::wstring::wstring((wstring *)local_50,pwVar4);
      pwVar4 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_50);
      std::__cxx11::wstring::wstring((wstring *)&local_130,pwVar4);
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                (&local_f0,vswprintf,0x20,L"%lu",this->m_ssl);
      paVar1 = &local_130.field_2;
      uVar8 = 3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        uVar8 = local_130.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_f0._M_string_length + local_130._M_string_length) {
        uVar8 = 3;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          uVar8 = local_f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_f0._M_string_length + local_130._M_string_length)
        goto LAB_0012308b;
        this_00 = (SslConnection *)
                  std::__cxx11::wstring::replace
                            ((ulong)&local_f0,0,(wchar_t *)0x0,(ulong)local_130._M_dataplus._M_p);
      }
      else {
LAB_0012308b:
        this_00 = (SslConnection *)
                  std::__cxx11::wstring::_M_append
                            ((wchar_t *)&local_130,(ulong)local_f0._M_dataplus._M_p);
      }
      std::__cxx11::wstring::wstring((wstring *)&local_110,(wstring *)this_00);
      OutputDebugString(local_110);
      if (local_110 != (wchar_t *)&local_100) {
        this_00 = (SslConnection *)(local_100 * 4 + 4);
        operator_delete(local_110,(ulong)this_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        this_00 = (SslConnection *)(local_f0.field_2._M_allocated_capacity * 4 + 4);
        operator_delete(local_f0._M_dataplus._M_p,(ulong)this_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        this_00 = (SslConnection *)(local_130.field_2._M_allocated_capacity * 4 + 4);
        operator_delete(local_130._M_dataplus._M_p,(ulong)this_00);
      }
      if (local_50[0] != local_40) {
        this_00 = (SslConnection *)(local_40[0] * 4 + 4);
        operator_delete(local_50[0],(ulong)this_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        this_00 = (SslConnection *)(local_d0.field_2._M_allocated_capacity * 4 + 4);
        operator_delete(local_d0._M_dataplus._M_p,(ulong)this_00);
      }
      if (local_b0 != local_a0) {
        this_00 = (SslConnection *)(local_a0[0] * 4 + 4);
        operator_delete(local_b0,(ulong)this_00);
      }
      if (local_70[0] != local_60) {
        this_00 = (SslConnection *)(local_60[0] * 4 + 4);
        operator_delete(local_70[0],(ulong)this_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        this_00 = (SslConnection *)(local_90.field_2._M_allocated_capacity * 4 + 4);
        operator_delete(local_90._M_dataplus._M_p,(ulong)this_00);
      }
      GetSslErrAsString_abi_cxx11_(&local_130,this_00);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x1344bc);
      pwVar6 = (wchar_t *)(plVar5 + 2);
      if ((wchar_t *)*plVar5 == pwVar6) {
        local_100 = *(long *)pwVar6;
        lStack_f8 = plVar5[3];
        local_110 = (wchar_t *)&local_100;
      }
      else {
        local_100 = *(long *)pwVar6;
        local_110 = (wchar_t *)*plVar5;
      }
      local_108 = plVar5[1];
      *plVar5 = (long)pwVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      OutputDebugStringA((char *)local_110);
      if (local_110 != (wchar_t *)&local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxSsl);
LAB_00123279:
  return this->m_iShutDownFlag;
}

Assistant:

int SslConnection::ShutDownConnection(int* iErrorHint/* = nullptr*/)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        if (m_iShutDownFlag < 1)
        {
            lock_guard<mutex> lk(m_mxSsl);

            m_iShutDownFlag = SSL_shutdown(m_ssl);
            if (m_iShutDownFlag < 0)
            {
                int iError = SSL_get_error(m_ssl, m_iShutDownFlag);
                if (iErrorHint != nullptr)
                    *iErrorHint = iError;
                if (iError != SSL_ERROR_WANT_READ)
                {
                    OutputDebugString(wstring(L"SSL_shutdown code: " + to_wstring(m_iShutDownFlag) + L" Error-Code: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>(m_ssl))).c_str());
                    OutputDebugStringA(string(", msg: " + GetSslErrAsString()).c_str());
                }
            }
        }
        return m_iShutDownFlag;
    }